

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

HashFunction flatbuffers::FindHashFunction16(char *name)

{
  int iVar1;
  ulong local_28;
  size_t i;
  size_t size;
  char *name_local;
  
  local_28 = 0;
  while( true ) {
    if (1 < local_28) {
      return (HashFunction)0x0;
    }
    iVar1 = strcmp(name,*(char **)(kHashFunctions16 + local_28 * 0x10));
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
  }
  return *(HashFunction *)(kHashFunctions16 + local_28 * 0x10 + 8);
}

Assistant:

inline NamedHashFunction<uint16_t>::HashFunction FindHashFunction16(
    const char *name) {
  std::size_t size = sizeof(kHashFunctions16) / sizeof(kHashFunctions16[0]);
  for (std::size_t i = 0; i < size; ++i) {
    if (std::strcmp(name, kHashFunctions16[i].name) == 0) {
      return kHashFunctions16[i].function;
    }
  }
  return nullptr;
}